

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O0

int oonf_cfg_init(int argc,char **argv,char *default_cfg_handler)

{
  list_entity *plVar1;
  oonf_appdata *poVar2;
  size_t sVar3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_subsystem *plugin;
  char *default_cfg_handler_local;
  char **argv_local;
  int argc_local;
  
  _oonf_cfg_instance.default_io = default_cfg_handler;
  cfg_add(&_oonf_cfg_instance);
  poVar2 = oonf_log_get_appdata();
  _global_entries[4].def.value = poVar2->default_lockfile;
  poVar2 = oonf_log_get_appdata();
  sVar3 = strlen(poVar2->default_lockfile);
  _global_entries[4].def.length = sVar3 + 1;
  cfg_schema_add(&_oonf_schema);
  cfg_schema_add_section(&_oonf_schema,&_global_section);
  _oonf_raw_db = cfg_db_add();
  if (_oonf_raw_db == (cfg_db *)0x0) {
    if ((log_global_mask[3] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x82,(void *)0x0,0,
               "Cannot create raw configuration database.");
    }
    cfg_remove(&_oonf_cfg_instance);
    argv_local._4_4_ = -1;
  }
  else {
    _oonf_work_db = cfg_db_add();
    if (_oonf_work_db == (cfg_db *)0x0) {
      if ((log_global_mask[3] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x89,(void *)0x0,0,
                 "Cannot create configuration database.");
      }
      cfg_db_remove(_oonf_raw_db);
      cfg_remove(&_oonf_cfg_instance);
      argv_local._4_4_ = -1;
    }
    else {
      _oonf_raw_db->schema = &_oonf_schema;
      memset(&config_global,0,0x30);
      _first_apply = true;
      _trigger_reload = false;
      _trigger_commit = false;
      _argc = argc;
      _argv = argv;
      plVar1 = oonf_plugin_tree.list_head.next;
      while( true ) {
        __tempptr = plVar1 + -7;
        if (plVar1->prev == oonf_plugin_tree.list_head.prev) break;
        oonf_subsystem_configure(&_oonf_schema,(oonf_subsystem *)__tempptr);
        plVar1 = plVar1->next;
      }
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
oonf_cfg_init(int argc, char **argv, const char *default_cfg_handler) {
  struct oonf_subsystem *plugin;

  _oonf_cfg_instance.default_io = default_cfg_handler;
  cfg_add(&_oonf_cfg_instance);

  /* initialize default for lockfile */
  _global_entries[IDX_LOCKFILE].def.value = oonf_log_get_appdata()->default_lockfile;
  _global_entries[IDX_LOCKFILE].def.length = strlen(oonf_log_get_appdata()->default_lockfile) + 1;

  /* initialize schema */
  cfg_schema_add(&_oonf_schema);
  cfg_schema_add_section(&_oonf_schema, &_global_section);

  /* initialize database */
  if ((_oonf_raw_db = cfg_db_add()) == NULL) {
    OONF_WARN(LOG_CONFIG, "Cannot create raw configuration database.");
    cfg_remove(&_oonf_cfg_instance);
    return -1;
  }

  /* initialize database */
  if ((_oonf_work_db = cfg_db_add()) == NULL) {
    OONF_WARN(LOG_CONFIG, "Cannot create configuration database.");
    cfg_db_remove(_oonf_raw_db);
    cfg_remove(&_oonf_cfg_instance);
    return -1;
  }

  cfg_db_link_schema(_oonf_raw_db, &_oonf_schema);

  /* initialize global config */
  memset(&config_global, 0, sizeof(config_global));
  _first_apply = true;
  _trigger_reload = false;
  _trigger_commit = false;

  _argc = argc;
  _argv = argv;

  /* initialize already existing plugins */
  avl_for_each_element(&oonf_plugin_tree, plugin, _node) {
    oonf_subsystem_configure(&_oonf_schema, plugin);
  }
  return 0;
}